

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.h
# Opt level: O3

void GEN_CS::call_cs_ldf<true>
               (multi_learner *base,multi_ex *examples,v_array<CB::label> *cb_labels,
               label *cs_labels,v_array<COST_SENSITIVE::label> *prepped_cs_labels,uint64_t offset,
               size_t id)

{
  uint64_t *puVar1;
  label *plVar2;
  label_t *plVar3;
  wclass **ppwVar4;
  undefined8 *puVar5;
  int iVar6;
  pointer ppeVar7;
  uint64_t uVar8;
  example *peVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 uVar13;
  size_t sVar14;
  label_t lVar15;
  label_t lVar16;
  pointer ppeVar17;
  long lVar18;
  ulong uVar19;
  multi_ex *__range1;
  iterator __begin2;
  
  v_array<CB::label>::clear(cb_labels);
  uVar19 = ((long)(cs_labels->costs)._end - (long)(cs_labels->costs)._begin >> 4) + 1;
  if ((ulong)((long)prepped_cs_labels->_end - (long)prepped_cs_labels->_begin >> 5) < uVar19) {
    v_array<COST_SENSITIVE::label>::resize(prepped_cs_labels,uVar19);
    prepped_cs_labels->_end = prepped_cs_labels->end_array;
  }
  ppeVar17 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppeVar7 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  uVar8 = ((*ppeVar17)->super_example_predict).ft_offset;
  if (ppeVar17 != ppeVar7) {
    lVar18 = 0;
    do {
      peVar9 = *ppeVar17;
      v_array<CB::label>::push_back(cb_labels,&(peVar9->l).cb);
      v_array<COST_SENSITIVE::wclass>::clear(&prepped_cs_labels->_begin[lVar18].costs);
      v_array<COST_SENSITIVE::wclass>::push_back
                (&prepped_cs_labels->_begin[lVar18].costs,(cs_labels->costs)._begin + lVar18);
      plVar2 = prepped_cs_labels->_begin + lVar18;
      fVar10 = *(float *)&(plVar2->costs)._begin;
      fVar11 = *(float *)((long)&(plVar2->costs)._begin + 4);
      fVar12 = *(float *)&(plVar2->costs)._end;
      uVar13 = *(undefined4 *)((long)&(plVar2->costs)._end + 4);
      ppwVar4 = &prepped_cs_labels->_begin[lVar18].costs.end_array;
      sVar14 = (size_t)ppwVar4[1];
      (peVar9->l).cs.costs.end_array = *ppwVar4;
      (peVar9->l).cs.costs.erase_count = sVar14;
      (peVar9->l).simple.label = fVar10;
      (peVar9->l).simple.weight = fVar11;
      (peVar9->l).simple.initial = fVar12;
      *(undefined4 *)((long)&peVar9->l + 0xc) = uVar13;
      (peVar9->super_example_predict).ft_offset = offset;
      ppeVar17 = ppeVar17 + 1;
      lVar18 = lVar18 + 1;
    } while (ppeVar17 != ppeVar7);
    ppeVar17 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    ppeVar7 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppeVar17 != ppeVar7) {
      iVar6 = *(int *)(base + 0xe0);
      do {
        puVar1 = &((*ppeVar17)->super_example_predict).ft_offset;
        *puVar1 = *puVar1 + (ulong)(uint)(iVar6 * (int)id);
        ppeVar17 = ppeVar17 + 1;
      } while (ppeVar17 != ppeVar7);
    }
  }
  (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),examples);
  ppeVar17 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppeVar7 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppeVar17 != ppeVar7) {
    iVar6 = *(int *)(base + 0xe0);
    do {
      puVar1 = &((*ppeVar17)->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uint)((int)id * iVar6);
      ppeVar17 = ppeVar17 + 1;
    } while (ppeVar17 != ppeVar7);
    ppeVar17 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    if ((examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
        super__Vector_impl_data._M_finish != ppeVar17) {
      lVar18 = 0;
      uVar19 = 0;
      do {
        peVar9 = ppeVar17[uVar19];
        plVar3 = (label_t *)((long)&(cb_labels->_begin->costs)._begin + lVar18);
        lVar15 = *plVar3;
        lVar16 = plVar3[1];
        puVar5 = (undefined8 *)((long)&(cb_labels->_begin->costs).end_array + lVar18);
        sVar14 = puVar5[1];
        (peVar9->l).cs.costs.end_array = (wclass *)*puVar5;
        (peVar9->l).cs.costs.erase_count = sVar14;
        (peVar9->l).multi = lVar15;
        (peVar9->l).cs.costs._end = (wclass *)lVar16;
        ((examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
         super__Vector_impl_data._M_start[uVar19]->super_example_predict).ft_offset = uVar8;
        uVar19 = uVar19 + 1;
        ppeVar17 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        lVar18 = lVar18 + 0x20;
      } while (uVar19 < (ulong)((long)(examples->
                                      super__Vector_base<example_*,_std::allocator<example_*>_>).
                                      _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar17 >>
                               3));
    }
  }
  return;
}

Assistant:

void call_cs_ldf(LEARNER::multi_learner& base, multi_ex& examples, v_array<CB::label>& cb_labels,
    COST_SENSITIVE::label& cs_labels, v_array<COST_SENSITIVE::label>& prepped_cs_labels, uint64_t offset, size_t id = 0)
{
  cb_labels.clear();
  if (prepped_cs_labels.size() < cs_labels.costs.size() + 1)
  {
    prepped_cs_labels.resize(cs_labels.costs.size() + 1);
    prepped_cs_labels.end() = prepped_cs_labels.end_array;
  }

  // 1st: save cb_label (into mydata) and store cs_label for each example, which will be passed into base.learn.
  // also save offsets
  uint64_t saved_offset = examples[0]->ft_offset;
  size_t index = 0;
  for (auto ec : examples)
  {
    cb_labels.push_back(ec->l.cb);
    prepped_cs_labels[index].costs.clear();
    prepped_cs_labels[index].costs.push_back(cs_labels.costs[index]);
    ec->l.cs = prepped_cs_labels[index++];
    ec->ft_offset = offset;
  }

  // 2nd: predict for each ex
  // // call base.predict for all examples
  if (is_learn)
    base.learn(examples, (int32_t)id);
  else
    base.predict(examples, (int32_t)id);

  // 3rd: restore cb_label for each example
  // (**ec).l.cb = array.element.
  // and restore offsets
  for (size_t i = 0; i < examples.size(); ++i)
  {
    examples[i]->l.cb = cb_labels[i];
    examples[i]->ft_offset = saved_offset;
  }
}